

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O0

void ncnn::pack_A_tile_fp32_to_int8_avx2
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000588;
  int in_stack_0000058c;
  int in_stack_00000590;
  int in_stack_00000594;
  Mat *in_stack_00000598;
  Mat *in_stack_000005a0;
  
  pack_A_tile_fp32_to_int8
            (in_stack_000005a0,in_stack_00000598,in_stack_00000594,in_stack_00000590,
             in_stack_0000058c,in_stack_00000588,(Mat *)CONCAT44(in_R8D,in_R9D));
  return;
}

Assistant:

void pack_A_tile_fp32_to_int8_avx2(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}